

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::find_or_prepare_insert_non_soo<char_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          *this,char **key)

{
  ctrl_t *pcVar1;
  char *__s;
  ushort uVar2;
  bool bVar3;
  ushort uVar4;
  uint32_t uVar5;
  uint uVar6;
  size_t sVar7;
  CommonFields *pCVar8;
  ctrl_t *pcVar9;
  slot_type *psVar10;
  size_t sVar11;
  PolicyFunctions *in_R9;
  ulong uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  __m128i match;
  ctrl_t cVar15;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  undefined1 auVar16 [16];
  iterator iVar32;
  string_view v;
  FindInfo target;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_98;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
  *local_80;
  ctrl_t *local_78;
  CommonFields *local_70;
  EqualElement<const_char_*> local_68;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  bVar3 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)this);
  if (bVar3) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf66,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, K = const char *]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)this);
  __s = *key;
  sVar7 = strlen(__s);
  v._M_str = __s;
  v._M_len = sVar7;
  pCVar8 = (CommonFields *)StringHash::operator()((StringHash *)this,v);
  probe(&local_98,(CommonFields *)this,(size_t)pCVar8);
  pcVar9 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this);
  auVar14 = ZEXT216(CONCAT11((char)pCVar8,(char)pCVar8) & 0x7f7f);
  auVar14 = pshuflw(auVar14,auVar14,0);
  uVar13 = auVar14._0_4_;
  local_48._4_4_ = uVar13;
  local_48._0_4_ = uVar13;
  local_48._8_4_ = uVar13;
  local_48._12_4_ = uVar13;
  local_70 = pCVar8;
  do {
    pcVar1 = pcVar9 + local_98.offset_;
    auVar14[0] = -(local_48[0] == *pcVar1);
    auVar14[1] = -(local_48[1] == pcVar1[1]);
    auVar14[2] = -(local_48[2] == pcVar1[2]);
    auVar14[3] = -(local_48[3] == pcVar1[3]);
    auVar14[4] = -(local_48[4] == pcVar1[4]);
    auVar14[5] = -(local_48[5] == pcVar1[5]);
    auVar14[6] = -(local_48[6] == pcVar1[6]);
    auVar14[7] = -(local_48[7] == pcVar1[7]);
    auVar14[8] = -(local_48[8] == pcVar1[8]);
    auVar14[9] = -(local_48[9] == pcVar1[9]);
    auVar14[10] = -(local_48[10] == pcVar1[10]);
    auVar14[0xb] = -(local_48[0xb] == pcVar1[0xb]);
    auVar14[0xc] = -(local_48[0xc] == pcVar1[0xc]);
    auVar14[0xd] = -(local_48[0xd] == pcVar1[0xd]);
    auVar14[0xe] = -(local_48[0xe] == pcVar1[0xe]);
    auVar14[0xf] = -(local_48[0xf] == pcVar1[0xf]);
    cVar15 = *pcVar1;
    cVar17 = pcVar1[1];
    cVar18 = pcVar1[2];
    cVar19 = pcVar1[3];
    cVar20 = pcVar1[4];
    cVar21 = pcVar1[5];
    cVar22 = pcVar1[6];
    cVar23 = pcVar1[7];
    cVar24 = pcVar1[8];
    cVar25 = pcVar1[9];
    cVar26 = pcVar1[10];
    cVar27 = pcVar1[0xb];
    cVar28 = pcVar1[0xc];
    cVar29 = pcVar1[0xd];
    cVar30 = pcVar1[0xe];
    cVar31 = pcVar1[0xf];
    for (uVar4 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf
        ; uVar4 != 0; uVar4 = uVar4 - 1 & uVar4) {
      local_80 = __return_storage_ptr__;
      local_78 = pcVar9;
      local_58 = cVar15;
      cStack_57 = cVar17;
      cStack_56 = cVar18;
      cStack_55 = cVar19;
      cStack_54 = cVar20;
      cStack_53 = cVar21;
      cStack_52 = cVar22;
      cStack_51 = cVar23;
      cStack_50 = cVar24;
      cStack_4f = cVar25;
      cStack_4e = cVar26;
      cStack_4d = cVar27;
      cStack_4c = cVar28;
      cStack_4b = cVar29;
      cStack_4a = cVar30;
      cStack_49 = cVar31;
      uVar5 = TrailingZeros<unsigned_short>(uVar4);
      local_68.rhs = key;
      local_68.eq = (key_equal *)this;
      psVar10 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)this);
      bVar3 = DecomposeValue<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>::EqualElement<char_const*>,std::basic_string_view<char,std::char_traits<char>>&>
                        (&local_68,psVar10 + (local_98.offset_ + uVar5 & local_98.mask_));
      __return_storage_ptr__ = local_80;
      if (bVar3) {
        local_98.mask_ = uVar5 + local_98.offset_ & local_98.mask_;
        bVar3 = false;
        goto LAB_00afcd04;
      }
      pcVar9 = local_78;
      cVar15 = local_58;
      cVar17 = cStack_57;
      cVar18 = cStack_56;
      cVar19 = cStack_55;
      cVar20 = cStack_54;
      cVar21 = cStack_53;
      cVar22 = cStack_52;
      cVar23 = cStack_51;
      cVar24 = cStack_50;
      cVar25 = cStack_4f;
      cVar26 = cStack_4e;
      cVar27 = cStack_4d;
      cVar28 = cStack_4c;
      cVar29 = cStack_4b;
      cVar30 = cStack_4a;
      cVar31 = cStack_49;
    }
    auVar16[0] = -(cVar15 == kEmpty);
    auVar16[1] = -(cVar17 == kEmpty);
    auVar16[2] = -(cVar18 == kEmpty);
    auVar16[3] = -(cVar19 == kEmpty);
    auVar16[4] = -(cVar20 == kEmpty);
    auVar16[5] = -(cVar21 == kEmpty);
    auVar16[6] = -(cVar22 == kEmpty);
    auVar16[7] = -(cVar23 == kEmpty);
    auVar16[8] = -(cVar24 == kEmpty);
    auVar16[9] = -(cVar25 == kEmpty);
    auVar16[10] = -(cVar26 == kEmpty);
    auVar16[0xb] = -(cVar27 == kEmpty);
    auVar16[0xc] = -(cVar28 == kEmpty);
    auVar16[0xd] = -(cVar29 == kEmpty);
    auVar16[0xe] = -(cVar30 == kEmpty);
    auVar16[0xf] = -(cVar31 == kEmpty);
    uVar4 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf;
    if (uVar4 != 0) {
      sVar11 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)this);
      pcVar9 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)this);
      pCVar8 = local_70;
      bVar3 = ShouldInsertBackwardsForDebug(sVar11,(size_t)local_70,pcVar9);
      if (bVar3) {
        uVar2 = 0xf;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar6 = (ushort)((uVar2 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar6 = TrailingZeros<unsigned_short>(uVar4);
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_98.index_;
      local_98.mask_ =
           PrepareInsertNonSoo((container_internal *)this,pCVar8,
                               uVar6 + local_98.offset_ & local_98.mask_,target,in_R9);
      bVar3 = true;
LAB_00afcd04:
      iVar32 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)this,local_98.mask_);
      __return_storage_ptr__->first = iVar32;
      __return_storage_ptr__->second = bVar3;
      return __return_storage_ptr__;
    }
    uVar12 = local_98.index_ + 0x10;
    local_98.offset_ = local_98.offset_ + uVar12 & local_98.mask_;
    local_98.index_ = uVar12;
    sVar11 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)this);
    if (sVar11 < uVar12) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, K = const char *]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }